

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O1

bool ON_IncreaseBezierDegree(int dim,bool is_rat,int order,int cv_stride,double *cv)

{
  int iVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  undefined7 in_register_00000031;
  double *pdVar5;
  double *pdVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  iVar4 = dim + (int)CONCAT71(in_register_00000031,is_rat);
  pdVar2 = cv + cv_stride * order;
  memcpy(pdVar2,pdVar2 + -(long)cv_stride,(long)iVar4 << 3);
  iVar1 = order + -1;
  if (iVar1 != 0) {
    dVar9 = (double)order;
    dVar10 = 1.0 / dVar9;
    uVar8 = cv_stride - iVar4;
    pdVar2 = pdVar2 + (int)~uVar8;
    pdVar5 = pdVar2 + -(long)cv_stride;
    dVar11 = 0.0;
    do {
      dVar9 = dVar9 + -1.0;
      dVar11 = dVar11 + 1.0;
      if (iVar4 != 0) {
        pdVar3 = pdVar2;
        pdVar6 = pdVar5;
        iVar7 = iVar4;
        do {
          pdVar5 = pdVar6 + -1;
          pdVar2 = pdVar3 + -1;
          *pdVar3 = *pdVar6 * dVar10 * dVar9 + *pdVar3 * dVar10 * dVar11;
          iVar7 = iVar7 + -1;
          pdVar3 = pdVar2;
          pdVar6 = pdVar5;
        } while (iVar7 != 0);
      }
      pdVar5 = pdVar5 + -(long)(int)uVar8;
      pdVar2 = pdVar2 + -(long)(int)uVar8;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return true;
}

Assistant:

bool ON_IncreaseBezierDegree(
        int     dim, 
        bool    is_rat, 
        int     order, 
        int     cv_stride,
        double* cv 
        )
/*****************************************************************************
Increase the degree of a Bezier
 
INPUT:
  cvdim (dim + is_rat)
  order ( >= 2 )
    order of input bezier
  cv            
    control vertices of bezier
  newcv    
    array of cvdim*(order+1) doubles (The cv and newcv pointers may be equal.)
OUTPUT:
  newcv  Control vertices of an Bezier with order (order+1).  The new Bezier
         and the old Bezier evaluate to the same point.  
COMMENTS:
  If {B_0, ... B_d} are the control vertices of the input Bezier, then
  {C_0, ..., C_{d+1}} are the control vertices of the returned Bezier, 
  where,
    C_0     = B_0
    C_k     = k/(d+1) * B_{k-1}  +  (d+1-k)/(d+1) * B_{k}(1 < k <= d)
    C_{d+1} = B_d
  The computation is done in a way that permits the pointers cv and newcv
  to be equal; i.e., if the cv array is long enough, the degree may be
  raised with a call like
    TL_IncreaseBezierDegree(cvdim,order,cv,cv);
EXAMPLE:
  raise_degree(TL_BEZIER* bez)
  {  
    // raise the degree of a TL_BEZIER
    bez->cv = (double*) onrealloc ( bez->cv, (bez->order+1)*(bez->dim+bez->is_rat) );
    TL_IncreaseBezierDegree ( bez->dim+bez->is_rat, bez->order,bez->cv,bez->cv );
    bez->order++;
  }
REFERENCE:
  BOHM-01, Page 7.
RELATED FUNCTIONS:
  TL_DecreaseBezierDegree
*****************************************************************************/
{
  double a0, a1, d, c0, c1; 
  int j;
  double* newcv = cv;
  const int cvdim = (is_rat)?dim+1:dim;
  const int dcv = cv_stride - cvdim;


  j = cv_stride*order;
  newcv += j;
  memcpy( newcv, newcv-cv_stride, cvdim*sizeof(*newcv) );
  newcv -= (dcv+1);
  cv = newcv - cv_stride;
  a0 = order;
  a1 = 0.0;
  d = 1.0/a0;
  while (--order) {
    a0 -= 1.0;
    a1 += 1.0;
    c0 = d*a0;
    c1 = d*a1;
    j = cvdim;
    while(j--) {
      *newcv = c0 * *cv + c1 * *newcv; 
      cv--; 
      newcv--;
    }
    cv -= dcv;
    newcv -= dcv;
  }
  return true;
}